

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_file_move(FILE *m_pFile,mz_uint64 to,mz_uint64 from,size_t length,mz_uint8 *move_buf,
                     size_t capacity_size)

{
  int iVar1;
  size_t sVar2;
  size_t capacity_size_local;
  mz_uint8 *move_buf_local;
  size_t length_local;
  mz_uint64 from_local;
  mz_uint64 to_local;
  FILE *m_pFile_local;
  
  if (capacity_size < length) {
    m_pFile_local = (FILE *)0xffffffffffffffe6;
  }
  else {
    iVar1 = fseeko((FILE *)m_pFile,from,0);
    if (iVar1 == 0) {
      sVar2 = fread(move_buf,1,length,(FILE *)m_pFile);
      if (sVar2 == length) {
        iVar1 = fseeko((FILE *)m_pFile,to,0);
        if (iVar1 == 0) {
          sVar2 = fwrite(move_buf,1,length,(FILE *)m_pFile);
          m_pFile_local = (FILE *)length;
          if (sVar2 != length) {
            m_pFile_local = (FILE *)0xffffffffffffffe3;
          }
        }
        else {
          m_pFile_local = (FILE *)0xffffffffffffffe5;
        }
      }
      else {
        m_pFile_local = (FILE *)0xffffffffffffffe4;
      }
    }
    else {
      m_pFile_local = (FILE *)0xffffffffffffffe5;
    }
  }
  return (ssize_t)m_pFile_local;
}

Assistant:

static ssize_t zip_file_move(MZ_FILE *m_pFile, const mz_uint64 to,
                             const mz_uint64 from, const size_t length,
                             mz_uint8 *move_buf, const size_t capacity_size) {
  if (length > capacity_size) {
    return ZIP_ECAPSIZE;
  }
  if (MZ_FSEEK64(m_pFile, from, SEEK_SET)) {
    return ZIP_EFSEEK;
  }
  if (fread(move_buf, 1, length, m_pFile) != length) {
    return ZIP_EFREAD;
  }
  if (MZ_FSEEK64(m_pFile, to, SEEK_SET)) {
    return ZIP_EFSEEK;
  }
  if (fwrite(move_buf, 1, length, m_pFile) != length) {
    return ZIP_EFWRITE;
  }
  return (ssize_t)length;
}